

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sys_Event.h
# Opt level: O1

__pid_t __thiscall
axl::sys::CondMutexEventBase<axl::sl::True>::wait
          (CondMutexEventBase<axl::sl::True> *this,void *__stat_loc)

{
  Mutex *__mutex;
  __pid_t _Var1;
  undefined8 unaff_R14;
  
  __mutex = &(this->m_condMutexPair).m_mutex;
  pthread_mutex_lock((pthread_mutex_t *)__mutex);
  _Var1 = (__pid_t)CONCAT71((int7)((ulong)unaff_R14 >> 8),1);
  if (this->m_state == false) {
    _Var1 = psx::Cond::wait((Cond *)this,__mutex);
  }
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  return _Var1;
}

Assistant:

bool
	wait(uint_t timeout = -1) {
		m_condMutexPair.lock();

		if (m_state) {
			if (!IsNotificationEvent()())
				m_state = false;

			m_condMutexPair.unlock();
			return true;
		}

		bool result = m_condMutexPair.wait(timeout);
		if (!result) {
			m_condMutexPair.unlock();
			return false;
		}

		if (!IsNotificationEvent()())
			m_state = false;

		m_condMutexPair.unlock();
		return true;
	}